

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O1

Vec_Ptr_t * Saig_ManBmcTerSimPo(Aig_Man_t *p)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  Vec_Ptr_t *vInfos;
  void **ppvVar4;
  uint *pPrev;
  int iFrame;
  Aig_Man_t *pAVar6;
  ulong uVar5;
  
  vInfos = (Vec_Ptr_t *)malloc(0x10);
  vInfos->nCap = 100;
  vInfos->nSize = 0;
  pAVar6 = (Aig_Man_t *)0x320;
  ppvVar4 = (void **)malloc(800);
  vInfos->pArray = ppvVar4;
  pPrev = (uint *)0x0;
  uVar2 = 0;
  do {
    uVar5 = uVar2;
    iFrame = (int)uVar5;
    if ((int)(uVar5 / 100) * 100 == iFrame) {
      Abc_Print((int)pAVar6,"Frame %5d\n",uVar5);
    }
    pPrev = Saig_ManBmcTerSimOne(p,pPrev);
    uVar1 = vInfos->nCap;
    if (vInfos->nSize == uVar1) {
      if ((int)uVar1 < 0x10) {
        if (vInfos->pArray == (void **)0x0) {
          ppvVar4 = (void **)malloc(0x80);
        }
        else {
          ppvVar4 = (void **)realloc(vInfos->pArray,0x80);
        }
        iVar3 = 0x10;
      }
      else {
        iVar3 = uVar1 * 2;
        if (iVar3 <= (int)uVar1) goto LAB_00563d75;
        if (vInfos->pArray == (void **)0x0) {
          ppvVar4 = (void **)malloc((ulong)uVar1 << 4);
        }
        else {
          ppvVar4 = (void **)realloc(vInfos->pArray,(ulong)uVar1 << 4);
        }
      }
      vInfos->pArray = ppvVar4;
      vInfos->nCap = iVar3;
    }
LAB_00563d75:
    iVar3 = vInfos->nSize;
    vInfos->nSize = iVar3 + 1;
    vInfos->pArray[iVar3] = pPrev;
    pAVar6 = p;
    iVar3 = Saig_ManBmcTerSimCount01Po(p,pPrev);
    uVar2 = (ulong)(iFrame + 1);
    if (iVar3 < p->nTruePos) {
      Abc_Print((int)pAVar6,"Detected terminary PO in frame %d.\n",uVar5);
      Saig_ManBmcCountNonternary(p,vInfos,iFrame);
      return vInfos;
    }
  } while( true );
}

Assistant:

Vec_Ptr_t * Saig_ManBmcTerSimPo( Aig_Man_t * p )
{
    Vec_Ptr_t * vInfos;
    unsigned * pInfo = NULL;
    int i, nPoBin;
    vInfos = Vec_PtrAlloc( 100 );
    for ( i = 0; ; i++ )
    {
        if ( i % 100 == 0 )
            Abc_Print( 1, "Frame %5d\n", i );
        pInfo = Saig_ManBmcTerSimOne( p, pInfo );
        Vec_PtrPush( vInfos, pInfo );
        nPoBin = Saig_ManBmcTerSimCount01Po( p, pInfo );
        if ( nPoBin < Saig_ManPoNum(p) )
            break;
    }
    Abc_Print( 1, "Detected terminary PO in frame %d.\n", i );
    Saig_ManBmcCountNonternary( p, vInfos, i );
    return vInfos;
}